

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void flip_bgr(sptr_t colors)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uchar *puVar5;
  
  puVar5 = colors.ptr;
  iVar3 = (int)(colors.size / 3);
  iVar2 = iVar3 * 3;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      uVar1 = puVar5[lVar4];
      puVar5[lVar4] = puVar5[lVar4 + 2];
      puVar5[lVar4 + 2] = uVar1;
      lVar4 = lVar4 + 3;
    } while (SBORROW4((int)lVar4,iVar2) != (int)lVar4 + iVar3 * -3 < 0);
  }
  return;
}

Assistant:

void flip_bgr(sptr_t colors)
{
	int i;
	int size = colors.size - (colors.size % 3);
	unsigned char *p = colors.ptr;
	for (i = 0; i < size; i += 3) {
		unsigned char tmp = *p;
		*p = *(p + 2);
		*(p + 2) = tmp;
		p += 3;
	}
}